

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int verify_sign(void *verify_ctx,uint16_t algo,ptls_iovec_t data,ptls_iovec_t signature)

{
  EVP_PKEY_CTX *pEVar1;
  EVP_PKEY_CTX *ctx_00;
  int iVar2;
  EVP_MD *type;
  undefined8 uVar3;
  int local_5c;
  EVP_PKEY_CTX *pEStack_58;
  int ret;
  EVP_PKEY_CTX *pkey_ctx;
  EVP_MD_CTX *ctx;
  ptls_openssl_signature_scheme_t *scheme;
  EVP_PKEY *key;
  void *pvStack_30;
  uint16_t algo_local;
  void *verify_ctx_local;
  ptls_iovec_t signature_local;
  ptls_iovec_t data_local;
  
  signature_local.base = (uint8_t *)signature.len;
  verify_ctx_local = signature.base;
  signature_local.len = (size_t)data.base;
  pkey_ctx = (EVP_PKEY_CTX *)0x0;
  pEStack_58 = (EVP_PKEY_CTX *)0x0;
  local_5c = 0;
  scheme = (ptls_openssl_signature_scheme_t *)verify_ctx;
  key._6_2_ = algo;
  pvStack_30 = verify_ctx;
  if ((uint8_t *)signature_local.len != (uint8_t *)0x0) {
    ctx = (EVP_MD_CTX *)ptls_openssl_lookup_signature_schemes((EVP_PKEY *)verify_ctx);
    if ((ptls_openssl_signature_scheme_t *)ctx == (ptls_openssl_signature_scheme_t *)0x0) {
      local_5c = 0x203;
    }
    else {
      for (; *(short *)ctx != -1; ctx = ctx + 0x10) {
        if (*(uint16_t *)ctx == key._6_2_) {
          pkey_ctx = (EVP_PKEY_CTX *)EVP_MD_CTX_new();
          if (pkey_ctx == (EVP_PKEY_CTX *)0x0) {
            local_5c = 0x201;
            goto LAB_0010efc0;
          }
          iVar2 = EVP_PKEY_get_id(scheme);
          ctx_00 = pkey_ctx;
          if (iVar2 == 0x43f) {
            iVar2 = EVP_DigestVerifyInit
                              ((EVP_MD_CTX *)pkey_ctx,&stack0xffffffffffffffa8,(EVP_MD *)0x0,
                               (ENGINE *)0x0,(EVP_PKEY *)scheme);
            if (iVar2 != 1) {
              local_5c = 0x203;
              goto LAB_0010efc0;
            }
            iVar2 = EVP_DigestVerify(pkey_ctx,verify_ctx_local,signature_local.base,
                                     signature_local.len,data.len);
            if (iVar2 != 1) {
              local_5c = 0x203;
              goto LAB_0010efc0;
            }
          }
          else {
            type = (EVP_MD *)(**(code **)(ctx + 8))();
            iVar2 = EVP_DigestVerifyInit
                              ((EVP_MD_CTX *)ctx_00,&stack0xffffffffffffffa8,type,(ENGINE *)0x0,
                               (EVP_PKEY *)scheme);
            if (iVar2 != 1) {
              local_5c = 0x203;
              goto LAB_0010efc0;
            }
            iVar2 = EVP_PKEY_get_id(scheme);
            if (iVar2 == 6) {
              iVar2 = EVP_PKEY_CTX_set_rsa_padding(pEStack_58,6);
              if (iVar2 != 1) {
                local_5c = 0x203;
                goto LAB_0010efc0;
              }
              iVar2 = EVP_PKEY_CTX_set_rsa_pss_saltlen(pEStack_58,0xffffffff);
              pEVar1 = pEStack_58;
              if (iVar2 != 1) {
                local_5c = 0x203;
                goto LAB_0010efc0;
              }
              uVar3 = (**(code **)(ctx + 8))();
              iVar2 = EVP_PKEY_CTX_set_rsa_mgf1_md(pEVar1,uVar3);
              if (iVar2 != 1) {
                local_5c = 0x203;
                goto LAB_0010efc0;
              }
            }
            iVar2 = EVP_DigestVerifyUpdate(pkey_ctx,signature_local.len,data.len);
            if (iVar2 != 1) {
              local_5c = 0x203;
              goto LAB_0010efc0;
            }
            iVar2 = EVP_DigestVerifyFinal
                              ((EVP_MD_CTX *)pkey_ctx,(uchar *)verify_ctx_local,
                               (size_t)signature_local.base);
            if (iVar2 != 1) {
              local_5c = 0x33;
              goto LAB_0010efc0;
            }
          }
          local_5c = 0;
          goto LAB_0010efc0;
        }
      }
      local_5c = 0x2f;
    }
  }
LAB_0010efc0:
  if (pkey_ctx != (EVP_PKEY_CTX *)0x0) {
    EVP_MD_CTX_free(pkey_ctx);
  }
  EVP_PKEY_free((EVP_PKEY *)scheme);
  return local_5c;
}

Assistant:

static int verify_sign(void *verify_ctx, uint16_t algo, ptls_iovec_t data, ptls_iovec_t signature)
{
    EVP_PKEY *key = verify_ctx;
    const ptls_openssl_signature_scheme_t *scheme;
    EVP_MD_CTX *ctx = NULL;
    EVP_PKEY_CTX *pkey_ctx = NULL;
    int ret = 0;

    if (data.base == NULL)
        goto Exit;

    if ((scheme = ptls_openssl_lookup_signature_schemes(key)) == NULL) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    for (; scheme->scheme_id != UINT16_MAX; ++scheme)
        if (scheme->scheme_id == algo)
            goto SchemeFound;
    ret = PTLS_ALERT_ILLEGAL_PARAMETER;
    goto Exit;

SchemeFound:
    if ((ctx = EVP_MD_CTX_create()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

#if PTLS_OPENSSL_HAVE_ED25519
    if (EVP_PKEY_id(key) == EVP_PKEY_ED25519) {
        /* ED25519 requires the use of the all-at-once function that appeared in OpenSSL 1.1.1, hence different path */
        if (EVP_DigestVerifyInit(ctx, &pkey_ctx, NULL, NULL, key) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        if (EVP_DigestVerify(ctx, signature.base, signature.len, data.base, data.len) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
    } else
#endif
    {
        if (EVP_DigestVerifyInit(ctx, &pkey_ctx, scheme->scheme_md(), NULL, key) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }

        if (EVP_PKEY_id(key) == EVP_PKEY_RSA) {
            if (EVP_PKEY_CTX_set_rsa_padding(pkey_ctx, RSA_PKCS1_PSS_PADDING) != 1) {
                ret = PTLS_ERROR_LIBRARY;
                goto Exit;
            }
            if (EVP_PKEY_CTX_set_rsa_pss_saltlen(pkey_ctx, -1) != 1) {
                ret = PTLS_ERROR_LIBRARY;
                goto Exit;
            }
            if (EVP_PKEY_CTX_set_rsa_mgf1_md(pkey_ctx, scheme->scheme_md()) != 1) {
                ret = PTLS_ERROR_LIBRARY;
                goto Exit;
            }
        }
        if (EVP_DigestVerifyUpdate(ctx, data.base, data.len) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        if (EVP_DigestVerifyFinal(ctx, signature.base, signature.len) != 1) {
            ret = PTLS_ALERT_DECRYPT_ERROR;
            goto Exit;
        }
    }

    ret = 0;

Exit:
    if (ctx != NULL)
        EVP_MD_CTX_destroy(ctx);
    EVP_PKEY_free(key);
    return ret;
}